

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void do_cmd_sell(command *cmd)

{
  byte *pbVar1;
  uint32_t *puVar2;
  ulong uVar3;
  loc grid;
  player_upkeep *ppVar4;
  uint type;
  _Bool _Var5;
  char cVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  store_conflict *store;
  undefined4 extraout_var;
  object *obj_00;
  char **ppcVar10;
  object *poVar11;
  wchar_t wVar12;
  player *ppVar13;
  char *fmt;
  _Bool none_left;
  object *obj;
  wchar_t amt;
  undefined8 local_1f8;
  object *sold_item;
  char o_name [120];
  object dummy_item;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  store = store_at((chunk *)cave,grid);
  none_left = false;
  wVar7 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if (wVar7 != L'\0') {
    return;
  }
  wVar7 = cmd_get_quantity((command_conflict *)cmd,"quantity",&amt,(uint)obj->number);
  if (wVar7 != L'\0') {
    return;
  }
  _Var5 = object_is_equipped(player->body,obj);
  if ((!_Var5) || (_Var5 = obj_can_takeoff(obj), _Var5)) {
    if (store == (store_conflict *)0x0) {
      fmt = "You cannot sell items when not in a store.";
    }
    else {
      _Var5 = store_will_buy(store,obj);
      if (_Var5) {
        object_copy_amt(&dummy_item,obj,amt);
        _Var5 = store_check_num(store,&dummy_item);
        if (_Var5) {
          cVar6 = gear_to_label(player,obj);
          wVar7 = price_item(store,&dummy_item,true,amt);
          ppVar13 = player;
          player->au = player->au + wVar7;
          if (obj->artifact != (artifact *)0x0) {
            history_find_artifact(ppVar13,obj->artifact);
            ppVar13 = player;
          }
          ppVar4 = ppVar13->upkeep;
          uVar3._0_4_ = ppVar4->notice;
          uVar3._4_4_ = ppVar4->update;
          ppVar4->notice = (int)(uVar3 | 0x20000000001);
          ppVar4->update = (int)((uVar3 | 0x20000000001) >> 0x20);
          pbVar1 = (byte *)((long)&ppVar4->redraw + 2);
          *pbVar1 = *pbVar1 | 6;
          wVar8 = object_value(&dummy_item,amt);
          local_1f8 = CONCAT44(extraout_var,wVar8);
          object_wipe(&dummy_item);
          object_flavor_aware(player,obj);
          obj->known->effect = obj->effect;
          while (_Var5 = object_fully_known(obj), !_Var5) {
            object_learn_unknown_rune(player,obj);
            player_know_object(player,obj);
          }
          obj_00 = gear_object_for_use(player,obj,amt,false,&none_left);
          sold_item = obj_00;
          wVar8 = object_value_real(obj_00,amt);
          object_desc(o_name,0x78,obj_00,0x43,player);
          if ((player->opts).opt[0x26] == true) {
            msg("You had %s (%c).",o_name,(ulong)(uint)(int)cVar6);
          }
          else {
            msg("You sold %s (%c) for %d gold.",o_name,(ulong)(uint)(int)cVar6,(ulong)(uint)wVar7);
            if ((wVar8 < L'\x01') && (wVar8 < wVar7)) {
              uVar9 = Rand_div(6);
              ppcVar10 = comment_worthless + (int)uVar9;
              type = 0x12;
            }
            else {
              wVar12 = (wchar_t)local_1f8;
              if ((wVar8 < wVar7) && (wVar8 < wVar12)) {
                uVar9 = Rand_div(4);
                ppcVar10 = comment_bad + (int)uVar9;
                type = 0x13;
              }
              else if (((wVar7 < wVar8) && (wVar12 < wVar8)) && (wVar8 < wVar12 * 4)) {
                uVar9 = Rand_div(5);
                ppcVar10 = comment_good + (int)uVar9;
                type = 0x14;
              }
              else {
                if ((wVar8 <= wVar7) || (wVar8 <= wVar12)) goto LAB_001ad7f5;
                uVar9 = Rand_div(5);
                ppcVar10 = comment_great + (int)uVar9;
                type = 0x15;
              }
            }
            msgt(type,"%s",*ppcVar10);
          }
LAB_001ad7f5:
          if (none_left == false) {
            apply_autoinscription(player,obj);
          }
          ppVar13 = player;
          puVar2 = &player->upkeep->notice;
          *puVar2 = *puVar2 | 2;
          notice_stuff(ppVar13);
          handle_stuff(player);
          poVar11 = store_carry(store,obj_00);
          if (poVar11 == (object *)0x0) {
            if (obj_00->artifact != (artifact *)0x0) {
              history_lose_artifact(player,obj_00->artifact);
            }
            if (obj_00->known != (object *)0x0) {
              object_delete((chunk *)0x0,(chunk *)0x0,&obj_00->known);
              obj_00->known = (object *)0x0;
            }
            object_delete((chunk *)0x0,(chunk *)0x0,&sold_item);
          }
          event_signal(EVENT_STORECHANGED);
          event_signal(EVENT_INVENTORY);
          event_signal(EVENT_EQUIPMENT);
          return;
        }
        object_wipe(&dummy_item);
        fmt = "I have not the room in my store to keep it.";
      }
      else {
        fmt = "I do not wish to purchase this item.";
      }
    }
  }
  else {
    fmt = "Hmmm, it seems to be stuck.";
  }
  msg(fmt);
  return;
}

Assistant:

void do_cmd_sell(struct command *cmd)
{
	int amt;
	struct object dummy_item;
	struct store *store = store_at(cave, player->grid);
	int price, dummy, value;
	char o_name[120];
	char label;

	struct object *obj, *sold_item;
	bool none_left = false;

	/* Get arguments */
	/* XXX-AS fill this out, split into cmd-store.c */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}

	/* Check we are somewhere we can sell the items. */
	if (!store) {
		msg("You cannot sell items when not in a store.");
		return;
	}

	/* Check the store wants the items being sold */
	if (!store_will_buy(store, obj)) {
		msg("I do not wish to purchase this item.");
		return;
	}

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(&dummy_item, obj, amt);

	/* Check if the store has space for the items */
	if (!store_check_num(store, &dummy_item)) {
		object_wipe(&dummy_item);
		msg("I have not the room in my store to keep it.");
		return;
	}

	/* Get the label */
	label = gear_to_label(player, obj);

	price = price_item(store, &dummy_item, true, amt);

	/* Get some money */
	player->au += price;

	/* Update the auto-history if selling an artifact that was previously
	 * un-IDed. (Ouch!) */
	if (obj->artifact)
		history_find_artifact(player, obj->artifact);

	/* Update the gear */
	player->upkeep->update |= (PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	/* Get the "apparent" value */
	dummy = object_value(&dummy_item, amt);
	/*
	 * Do not need the dummy any more so release the memory allocated
	 * within it.
	 */
	object_wipe(&dummy_item);

	/* Know flavor of consumables */
	object_flavor_aware(player, obj);
	obj->known->effect = obj->effect;
	while (!object_fully_known(obj)) {
		object_learn_unknown_rune(player, obj);
		player_know_object(player, obj);
	}

	/* Take a proper copy of the now known-about object. */
	sold_item = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Get the "actual" value */
	value = object_value_real(sold_item, amt);

	/* Get the description all over again */
	object_desc(o_name, sizeof(o_name), sold_item,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Describe the result (in message buffer) */
	if (OPT(player, birth_no_selling)) {
		msg("You had %s (%c).", o_name, label);
	} else {
		msg("You sold %s (%c) for %d gold.", o_name, label, price);

		/* Analyze the prices (and comment verbally) */
		purchase_analyze(price, value, dummy);
	}

	/* Autoinscribe if we still have any */
	if (!none_left)
		apply_autoinscription(player, obj);

	/* Set ignore flag */
	player->upkeep->notice |= PN_IGNORE;

	/* Notice if pack items need to be combined or reordered */
	notice_stuff(player);

	/* Handle stuff */
	handle_stuff(player);

	/* The store gets that (known) object */
	if (!store_carry(store, sold_item)) {
		/* The store rejected it; delete. */
		if (sold_item->artifact) {
			history_lose_artifact(player, sold_item->artifact);
		}
		if (sold_item->known) {
			object_delete(NULL, NULL, &sold_item->known);
			sold_item->known = NULL;
		}
		object_delete(NULL, NULL, &sold_item);
	}

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}